

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> Catch::list(shared_ptr<Catch::Config> *config)

{
  bool bVar1;
  IMutableContext *pIVar2;
  element_type *peVar3;
  unsigned_long uVar4;
  size_t sVar5;
  Option<unsigned_long> *this;
  unsigned_long *_value;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char acVar6 [8];
  Option<unsigned_long> *in_RDI;
  Option<unsigned_long> OVar7;
  Config *in_stack_00000040;
  Option<unsigned_long> *listedCount;
  Config *in_stack_00000280;
  shared_ptr<Catch::Config> *in_stack_ffffffffffffff28;
  Option<unsigned_long> *in_stack_ffffffffffffff30;
  unsigned_long local_78;
  long local_70;
  unsigned_long local_68;
  long local_60;
  unsigned_long local_58;
  long local_50;
  unsigned_long local_48;
  Config *in_stack_ffffffffffffffc0;
  undefined1 local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  Option<unsigned_long>::Option(in_RDI);
  pIVar2 = getCurrentMutableContext();
  std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
            ((shared_ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
            );
  (*(pIVar2->super_IContext)._vptr_IContext[7])(pIVar2,local_38);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x139d39);
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139d46);
  bVar1 = Config::listTests(peVar3);
  if (bVar1) {
    local_48 = 0;
    uVar4 = Option<unsigned_long>::valueOr(in_RDI,&local_48);
    clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffff30);
    sVar5 = listTests(in_stack_00000040);
    in_stack_ffffffffffffffc0 = (Config *)(uVar4 + sVar5);
    Option<unsigned_long>::operator=
              (in_stack_ffffffffffffff30,(unsigned_long *)in_stack_ffffffffffffff28);
  }
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139e0f);
  bVar1 = Config::listTestNamesOnly(peVar3);
  if (bVar1) {
    local_58 = 0;
    uVar4 = Option<unsigned_long>::valueOr(in_RDI,&local_58);
    clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffff30);
    sVar5 = listTestsNamesOnly(in_stack_ffffffffffffffc0);
    local_50 = uVar4 + sVar5;
    Option<unsigned_long>::operator=
              (in_stack_ffffffffffffff30,(unsigned_long *)in_stack_ffffffffffffff28);
  }
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139e96);
  bVar1 = Config::listTags(peVar3);
  if (bVar1) {
    local_68 = 0;
    uVar4 = Option<unsigned_long>::valueOr(in_RDI,&local_68);
    clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffff30);
    sVar5 = listTags(in_stack_00000280);
    local_60 = uVar4 + sVar5;
    Option<unsigned_long>::operator=
              (in_stack_ffffffffffffff30,(unsigned_long *)in_stack_ffffffffffffff28);
  }
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x139f11);
  bVar1 = Config::listReporters(peVar3);
  acVar6 = extraout_RDX;
  if (bVar1) {
    local_78 = 0;
    this = (Option<unsigned_long> *)Option<unsigned_long>::valueOr(in_RDI,&local_78);
    _value = (unsigned_long *)listReporters();
    local_70 = (long)_value + (long)(this->storage + -8);
    Option<unsigned_long>::operator=(this,_value);
    acVar6 = extraout_RDX_00;
  }
  OVar7.storage[0] = acVar6[0];
  OVar7.storage[1] = acVar6[1];
  OVar7.storage[2] = acVar6[2];
  OVar7.storage[3] = acVar6[3];
  OVar7.storage[4] = acVar6[4];
  OVar7.storage[5] = acVar6[5];
  OVar7.storage[6] = acVar6[6];
  OVar7.storage[7] = acVar6[7];
  OVar7.nullableValue = (unsigned_long *)in_RDI;
  return OVar7;
}

Assistant:

Option<std::size_t> list( std::shared_ptr<Config> const& config ) {
        Option<std::size_t> listedCount;
        getCurrentMutableContext().setConfig( config );
        if( config->listTests() )
            listedCount = listedCount.valueOr(0) + listTests( *config );
        if( config->listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( *config );
        if( config->listTags() )
            listedCount = listedCount.valueOr(0) + listTags( *config );
        if( config->listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters();
        return listedCount;
    }